

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::Statement::visit<hgdb::rtl::Serializer&>(Statement *this,Serializer *visitor)

{
  logic_error *this_00;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(this->kind) {
  case Invalid:
  case Empty:
  case VariableDeclaration:
  case Return:
  case Continue:
  case Break:
  case Disable:
  case DisableFork:
  case WaitFork:
  case EventTrigger:
  case ProceduralAssign:
  case ProceduralDeassign:
  case RandSequence:
    return;
  case List:
    StatementList::visitStmts<hgdb::rtl::Serializer&>((StatementList *)this,visitor);
    return;
  case Block:
    BlockStatement::visitStmts<hgdb::rtl::Serializer&>((BlockStatement *)this,visitor);
    return;
  case ExpressionStatement:
    hgdb::rtl::Serializer::handle(visitor,(ExpressionStatement *)this);
    return;
  case Conditional:
    hgdb::rtl::Serializer::handle(visitor,(ConditionalStatement *)this);
    return;
  case Case:
    hgdb::rtl::Serializer::handle(visitor,(CaseStatement *)this);
    return;
  case PatternCase:
    PatternCaseStatement::visitStmts<hgdb::rtl::Serializer&>((PatternCaseStatement *)this,visitor);
    return;
  case ForLoop:
    ForLoopStatement::visitStmts<hgdb::rtl::Serializer&>((ForLoopStatement *)this,visitor);
    return;
  case RepeatLoop:
    RepeatLoopStatement::visitStmts<hgdb::rtl::Serializer&>((RepeatLoopStatement *)this,visitor);
    return;
  case ForeachLoop:
    ForeachLoopStatement::visitStmts<hgdb::rtl::Serializer&>((ForeachLoopStatement *)this,visitor);
    return;
  case WhileLoop:
    WhileLoopStatement::visitStmts<hgdb::rtl::Serializer&>((WhileLoopStatement *)this,visitor);
    return;
  case DoWhileLoop:
    DoWhileLoopStatement::visitStmts<hgdb::rtl::Serializer&>((DoWhileLoopStatement *)this,visitor);
    return;
  case ForeverLoop:
    ForeverLoopStatement::visitStmts<hgdb::rtl::Serializer&>((ForeverLoopStatement *)this,visitor);
    return;
  case Timed:
    TimedStatement::visitStmts<hgdb::rtl::Serializer&>((TimedStatement *)this,visitor);
    return;
  case ImmediateAssertion:
    ImmediateAssertionStatement::visitStmts<hgdb::rtl::Serializer&>
              ((ImmediateAssertionStatement *)this,visitor);
    return;
  case ConcurrentAssertion:
    ConcurrentAssertionStatement::visitStmts<hgdb::rtl::Serializer&>
              ((ConcurrentAssertionStatement *)this,visitor);
    return;
  case Wait:
    WaitStatement::visitStmts<hgdb::rtl::Serializer&>((WaitStatement *)this,visitor);
    return;
  case WaitOrder:
    WaitOrderStatement::visitStmts<hgdb::rtl::Serializer&>((WaitOrderStatement *)this,visitor);
    return;
  case RandCase:
    RandCaseStatement::visitStmts<hgdb::rtl::Serializer&>((RandCaseStatement *)this,visitor);
    return;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_d9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_d8,0x10e);
    std::operator+(&local_78,&local_98,&local_d8);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

decltype(auto) Statement::visit(TVisitor&& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case StatementKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case StatementKind::Invalid: return visitor.visitInvalid(*this, std::forward<Args>(args)...);
        CASE(Empty, EmptyStatement);
        CASE(List, StatementList);
        CASE(Block, BlockStatement);
        CASE(ExpressionStatement, ExpressionStatement);
        CASE(VariableDeclaration, VariableDeclStatement);
        CASE(Return, ReturnStatement);
        CASE(Break, BreakStatement);
        CASE(Continue, ContinueStatement);
        CASE(Disable, DisableStatement);
        CASE(Conditional, ConditionalStatement);
        CASE(Case, CaseStatement);
        CASE(PatternCase, PatternCaseStatement);
        CASE(ForLoop, ForLoopStatement);
        CASE(RepeatLoop, RepeatLoopStatement);
        CASE(ForeachLoop, ForeachLoopStatement);
        CASE(WhileLoop, WhileLoopStatement);
        CASE(DoWhileLoop, DoWhileLoopStatement);
        CASE(ForeverLoop, ForeverLoopStatement);
        CASE(Timed, TimedStatement);
        CASE(ImmediateAssertion, ImmediateAssertionStatement);
        CASE(ConcurrentAssertion, ConcurrentAssertionStatement);
        CASE(DisableFork, DisableForkStatement);
        CASE(Wait, WaitStatement);
        CASE(WaitFork, WaitForkStatement);
        CASE(WaitOrder, WaitOrderStatement);
        CASE(EventTrigger, EventTriggerStatement);
        CASE(ProceduralAssign, ProceduralAssignStatement);
        CASE(ProceduralDeassign, ProceduralDeassignStatement);
        CASE(RandCase, RandCaseStatement);
        CASE(RandSequence, RandSequenceStatement);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}